

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlDate.cpp
# Opt level: O0

filepos_t __thiscall
libebml::EbmlDate::RenderData(EbmlDate *this,IOCallback *output,bool param_2,bool param_3)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *Buffer;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined1 local_30 [8];
  big_int64 b64;
  bool param_3_local;
  bool param_2_local;
  IOCallback *output_local;
  EbmlDate *this_local;
  
  b64.endian_value._6_1_ = param_3;
  b64.endian_value._7_1_ = param_2;
  iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])();
  if (CONCAT44(extraout_var,iVar1) != 0) {
    iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])();
    if (CONCAT44(extraout_var_00,iVar1) != 8) {
      __assert_fail("GetSize() == 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/ebml/src/EbmlDate.cpp"
                    ,0x45,
                    "virtual filepos_t libebml::EbmlDate::RenderData(IOCallback &, bool, bool)");
    }
    Endian<long,_(libebml::endianess)0>::Endian
              ((Endian<long,_(libebml::endianess)0> *)local_30,this->myDate);
    Buffer = Endian<long,_(libebml::endianess)0>::endian
                       ((Endian<long,_(libebml::endianess)0> *)local_30);
    iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])();
    IOCallback::writeFully(output,Buffer,CONCAT44(extraout_var_01,iVar1));
  }
  iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])();
  return CONCAT44(extraout_var_02,iVar1);
}

Assistant:

filepos_t EbmlDate::RenderData(IOCallback & output, bool /* bForceRender */, bool  /* bWithDefault */)
{
  if (GetSize() != 0) {
    assert(GetSize() == 8);
    big_int64 b64(myDate);

    output.writeFully(&b64.endian(),GetSize());
  }

  return GetSize();
}